

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O1

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::mt19937>::addin(mt19937 *r)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if (0x26f < (r->S).mti) {
    lVar3 = 0;
    do {
      uVar2 = (r->S).mt[lVar3 + 1];
      (r->S).mt[lVar3] =
           *(uint *)(&DAT_0011c140 + (ulong)(uVar2 & 1) * 4) ^ (r->S).mt[lVar3 + 0x18d] ^
           (uVar2 & 0x7ffffffe | (r->S).mt[lVar3] & 0x80000000) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe3);
    lVar3 = 0;
    do {
      uVar2 = (r->S).mt[lVar3 + 0xe4];
      (r->S).mt[lVar3 + 0xe3] =
           *(uint *)(&DAT_0011c140 + (ulong)(uVar2 & 1) * 4) ^ (r->S).mt[lVar3] ^
           (uVar2 & 0x7ffffffe | (r->S).mt[lVar3 + 0xe3] & 0x80000000) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18c);
    uVar2 = (r->S).mt[0];
    (r->S).mt[0x26f] =
         *(uint *)(&DAT_0011c140 + (ulong)(uVar2 & 1) * 4) ^ (r->S).mt[0x18c] ^
         (uVar2 & 0x7ffffffe | (r->S).mt[0x26f] & 0x80000000) >> 1;
    (r->S).mti = 0;
  }
  iVar1 = (r->S).mti;
  (r->S).mti = iVar1 + 1;
  uVar2 = (r->S).mt[iVar1];
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return (double)(uVar2 >> 0x12 ^ uVar2);
}

Assistant:

inline mt19937::result_type mt19937::operator()() {
    const result_type mag01[2]{0u, 0x9908b0dfu};
    if (S.mti >= N) {  // generate N words at one time
      int i{0};
      for (; i < N - M; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & mt19937::LM)};
        S.mt[i] = S.mt[i + M] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      for (; i < N - 1; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & LM)};
        S.mt[i] = S.mt[i + (M - N)] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      const result_type x{(S.mt[N - 1] & mt19937::UM) | (S.mt[0] & mt19937::LM)};
      S.mt[N - 1] = S.mt[M - 1] ^ (x >> 1u) ^ mag01[x & 0x1u];
      S.mti = 0;
    }
    result_type x{S.mt[S.mti++]};
    x ^= (x >> 11u);
    x ^= (x << 7u) & 0x9d2c5680u;
    x ^= (x << 15u) & 0xefc60000u;
    x ^= (x >> 18u);
    return x;
  }